

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_read_sod(opj_j2k_t *j2k)

{
  opj_cio_t *cio;
  uint uVar1;
  int iVar2;
  int iVar3;
  opj_codestream_info_t *poVar4;
  uchar *puVar5;
  int iVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  
  cio = j2k->cio;
  iVar6 = j2k->curtileno;
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    iVar2 = cio_tell(cio);
    poVar4 = j2k->cstr_info;
    iVar3 = j2k->cur_tp_num;
    poVar4->tile[j2k->curtileno].tp[iVar3].tp_end_header = j2k->pos_correction + iVar2 + -1;
    if ((long)iVar3 == 0) {
      iVar3 = cio_tell(cio);
      poVar4 = j2k->cstr_info;
      poVar4->tile[j2k->curtileno].end_header = j2k->pos_correction + iVar3 + -1;
    }
    poVar4->packno = 0;
  }
  iVar3 = *(int *)&j2k->eot;
  puVar5 = cio_getbp(cio);
  uVar8 = iVar3 - (int)puVar5;
  iVar3 = cio_numbytesleft(cio);
  uVar1 = iVar3 + 1U;
  if ((int)uVar8 < (int)(iVar3 + 1U)) {
    uVar1 = uVar8;
  }
  iVar2 = cio_numbytesleft(cio);
  puVar5 = (uchar *)realloc(j2k->tile_data[iVar6],(long)j2k->tile_len[iVar6] + (long)(int)uVar1);
  piVar7 = j2k->tile_len;
  iVar3 = piVar7[iVar6];
  if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      uVar8 = cio_read(cio,1);
      puVar5[uVar9 + (long)iVar3] = (uchar)uVar8;
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
    piVar7 = j2k->tile_len;
    iVar3 = piVar7[iVar6];
  }
  piVar7[iVar6] = iVar3 + uVar1;
  j2k->tile_data[iVar6] = puVar5;
  iVar6 = 8;
  if (uVar1 == iVar2 + 1U) {
    iVar6 = 0x40;
  }
  j2k->state = iVar6;
  j2k->cur_tp_num = j2k->cur_tp_num + 1;
  return;
}

Assistant:

static void j2k_read_sod(opj_j2k_t *j2k) {
	int len, truncate = 0, i;
	unsigned char *data = NULL, *data_ptr = NULL;

	opj_cio_t *cio = j2k->cio;
	int curtileno = j2k->curtileno;

	/* Index */
	if (j2k->cstr_info) {
		j2k->cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
			cio_tell(cio) + j2k->pos_correction - 1;
		if (j2k->cur_tp_num == 0)
			j2k->cstr_info->tile[j2k->curtileno].end_header = cio_tell(cio) + j2k->pos_correction - 1;
		j2k->cstr_info->packno = 0;
	}
	
	len = int_min(j2k->eot - cio_getbp(cio), cio_numbytesleft(cio) + 1);

	if (len == cio_numbytesleft(cio) + 1) {
		truncate = 1;		/* Case of a truncate codestream */
	}	

	data = j2k->tile_data[curtileno];
	data = (unsigned char*) opj_realloc(data, (j2k->tile_len[curtileno] + len) * sizeof(unsigned char));

	data_ptr = data + j2k->tile_len[curtileno];
	for (i = 0; i < len; i++) {
		data_ptr[i] = cio_read(cio, 1);
	}

	j2k->tile_len[curtileno] += len;
	j2k->tile_data[curtileno] = data;
	
	if (!truncate) {
		j2k->state = J2K_STATE_TPHSOT;
	} else {
		j2k->state = J2K_STATE_NEOC;	/* RAJOUTE !! */
	}
	j2k->cur_tp_num++;
}